

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextJoin(char **textList,int count,char *delimiter)

{
  uint uVar1;
  uint uVar2;
  int local_34;
  int textLength;
  int i;
  int delimiterLen;
  int totalLength;
  char *textPtr;
  char *delimiter_local;
  int count_local;
  char **textList_local;
  
  memset(TextJoin::text,0,0x400);
  _delimiterLen = TextJoin::text;
  i = 0;
  uVar1 = TextLength(delimiter);
  for (local_34 = 0; local_34 < count; local_34 = local_34 + 1) {
    uVar2 = TextLength(textList[local_34]);
    if ((int)(i + uVar2) < 0x400) {
      memcpy(_delimiterLen,textList[local_34],(long)(int)uVar2);
      i = uVar2 + i;
      _delimiterLen = _delimiterLen + (int)uVar2;
      if ((0 < (int)uVar1) && (local_34 < count + -1)) {
        memcpy(_delimiterLen,delimiter,(long)(int)uVar1);
        i = uVar1 + i;
        _delimiterLen = _delimiterLen + (int)uVar1;
      }
    }
  }
  return TextJoin::text;
}

Assistant:

const char *TextJoin(const char **textList, int count, const char *delimiter)
{
    static char text[MAX_TEXT_BUFFER_LENGTH] = { 0 };
    memset(text, 0, MAX_TEXT_BUFFER_LENGTH);
    char *textPtr = text;

    int totalLength = 0;
    int delimiterLen = TextLength(delimiter);

    for (int i = 0; i < count; i++)
    {
        int textLength = TextLength(textList[i]);

        // Make sure joined text could fit inside MAX_TEXT_BUFFER_LENGTH
        if ((totalLength + textLength) < MAX_TEXT_BUFFER_LENGTH)
        {
            memcpy(textPtr, textList[i], textLength);
            totalLength += textLength;
            textPtr += textLength;

            if ((delimiterLen > 0) && (i < (count - 1)))
            {
                memcpy(textPtr, delimiter, delimiterLen);
                totalLength += delimiterLen;
                textPtr += delimiterLen;
            }
        }
    }

    return text;
}